

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

texture_type_t tinyobj::parseTextureType(char **token,texture_type_t default_value)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  texture_type_t local_24;
  texture_type_t ty;
  char *end;
  texture_type_t default_value_local;
  char **token_local;
  
  sVar3 = strspn(*token," \t");
  *token = *token + sVar3;
  pcVar1 = *token;
  sVar3 = strcspn(*token," \t\r");
  iVar2 = strncmp(*token,"cube_top",8);
  if (iVar2 == 0) {
    local_24 = TEXTURE_TYPE_CUBE_TOP;
  }
  else {
    iVar2 = strncmp(*token,"cube_bottom",0xb);
    if (iVar2 == 0) {
      local_24 = TEXTURE_TYPE_CUBE_BOTTOM;
    }
    else {
      iVar2 = strncmp(*token,"cube_left",9);
      if (iVar2 == 0) {
        local_24 = TEXTURE_TYPE_CUBE_LEFT;
      }
      else {
        iVar2 = strncmp(*token,"cube_right",10);
        if (iVar2 == 0) {
          local_24 = TEXTURE_TYPE_CUBE_RIGHT;
        }
        else {
          iVar2 = strncmp(*token,"cube_front",10);
          if (iVar2 == 0) {
            local_24 = TEXTURE_TYPE_CUBE_FRONT;
          }
          else {
            iVar2 = strncmp(*token,"cube_back",9);
            if (iVar2 == 0) {
              local_24 = TEXTURE_TYPE_CUBE_BACK;
            }
            else {
              iVar2 = strncmp(*token,"sphere",6);
              local_24 = default_value;
              if (iVar2 == 0) {
                local_24 = TEXTURE_TYPE_SPHERE;
              }
            }
          }
        }
      }
    }
  }
  *token = pcVar1 + sVar3;
  return local_24;
}

Assistant:

static inline texture_type_t parseTextureType(
    const char **token, texture_type_t default_value = TEXTURE_TYPE_NONE) {
  (*token) += strspn((*token), " \t");
  const char *end = (*token) + strcspn((*token), " \t\r");
  texture_type_t ty = default_value;

  if ((0 == strncmp((*token), "cube_top", strlen("cube_top")))) {
    ty = TEXTURE_TYPE_CUBE_TOP;
  } else if ((0 == strncmp((*token), "cube_bottom", strlen("cube_bottom")))) {
    ty = TEXTURE_TYPE_CUBE_BOTTOM;
  } else if ((0 == strncmp((*token), "cube_left", strlen("cube_left")))) {
    ty = TEXTURE_TYPE_CUBE_LEFT;
  } else if ((0 == strncmp((*token), "cube_right", strlen("cube_right")))) {
    ty = TEXTURE_TYPE_CUBE_RIGHT;
  } else if ((0 == strncmp((*token), "cube_front", strlen("cube_front")))) {
    ty = TEXTURE_TYPE_CUBE_FRONT;
  } else if ((0 == strncmp((*token), "cube_back", strlen("cube_back")))) {
    ty = TEXTURE_TYPE_CUBE_BACK;
  } else if ((0 == strncmp((*token), "sphere", strlen("sphere")))) {
    ty = TEXTURE_TYPE_SPHERE;
  }

  (*token) = end;
  return ty;
}